

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

void __thiscall xLearn::FromDMReader::Initialize(FromDMReader *this,DMatrix **dmatrix)

{
  bool label;
  uint uVar1;
  DMatrix *pDVar2;
  pointer puVar3;
  pointer puVar4;
  int i;
  ulong uVar5;
  
  pDVar2 = *dmatrix;
  this->data_ptr_ = pDVar2;
  label = pDVar2->has_label;
  (this->super_Reader).has_label_ = label;
  uVar1 = pDVar2->row_length;
  this->num_samples_ = uVar1;
  DMatrix::ReAlloc(&(this->super_Reader).data_samples_,(ulong)uVar1,label);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->order_,(ulong)this->num_samples_);
  puVar3 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (uVar5 = 0; uVar5 < (ulong)((long)puVar4 - (long)puVar3 >> 2); uVar5 = uVar5 + 1) {
    puVar3[uVar5] = (uint)uVar5;
  }
  return;
}

Assistant:

void FromDMReader::Initialize(xLearn::DMatrix* &dmatrix) { 
  this->data_ptr_ = dmatrix;
  has_label_ = this->data_ptr_->has_label;
  num_samples_ = this->data_ptr_->row_length;
  data_samples_.ReAlloc(num_samples_, has_label_);
  // for shuffle
  order_.resize(num_samples_);
  for (int i = 0; i < order_.size(); ++i) {
    order_[i] = i;
  }
}